

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

string * glu::sl::injectExtensionRequirements
                   (string *__return_storage_ptr__,string *baseCode,
                   vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                   *extensions,ShaderType shaderType)

{
  undefined8 *puVar1;
  pointer pcVar2;
  char cVar3;
  pointer pRVar4;
  ostream *poVar5;
  istream *piVar6;
  undefined8 uVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  string line;
  ostringstream extStr;
  ostringstream resultBuf;
  istringstream baseCodeBuf;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  char *local_4c8;
  ulong local_4c0;
  char local_4b8;
  undefined7 uStack_4b7;
  string *local_4a8;
  ostringstream local_4a0 [112];
  ios_base local_430 [264];
  ostringstream local_328 [112];
  ios_base local_2b8 [264];
  long local_1b0 [15];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)baseCode,_S_in);
  std::__cxx11::ostringstream::ostringstream(local_328);
  local_4c8 = &local_4b8;
  local_4c0 = 0;
  local_4b8 = '\0';
  local_4a8 = baseCode;
  std::__cxx11::ostringstream::ostringstream(local_4a0);
  pRVar4 = (extensions->
           super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((extensions->
      super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>).
      _M_impl.super__Vector_impl_data._M_finish != pRVar4) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      if ((*(uint *)((long)&pRVar4->effectiveStages + lVar9) & 1 << ((byte)shaderType & 0x1f)) != 0)
      {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a0,"#extension ",0xb);
        puVar1 = *(undefined8 **)
                  ((long)&(((extensions->
                            super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                            )._M_impl.super__Vector_impl_data._M_start)->alternatives).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl + lVar9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_4a0,(char *)*puVar1,puVar1[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," : require\n",0xb);
      }
      uVar10 = uVar10 + 1;
      pRVar4 = (extensions->
               super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x20;
    } while (uVar10 < (ulong)((long)(extensions->
                                    super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 5)
            );
  }
  std::__cxx11::stringbuf::str();
  if (local_4e8 != local_4d8) {
    operator_delete(local_4e8,local_4d8[0] + 1);
  }
  if (local_4e0 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (local_4a8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + local_4a8->_M_string_length);
  }
  else {
    bVar8 = true;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                              (char)(istream *)local_1b0);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)&local_4c8,cVar3);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      uVar10 = std::__cxx11::string::find_first_not_of((char *)&local_4c8,0xbb8444,0);
      if (uVar10 == 0xffffffffffffffff) {
LAB_00a5e463:
        if (bVar8) {
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_328,(char *)local_4e8,local_4e0);
          if (local_4e8 != local_4d8) {
            operator_delete(local_4e8,local_4d8[0] + 1);
          }
          bVar8 = false;
        }
      }
      else {
        if (local_4c0 <= uVar10) {
          uVar7 = std::__throw_out_of_range_fmt
                            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",
                             uVar10);
          std::__cxx11::ostringstream::~ostringstream(local_4a0);
          std::ios_base::~ios_base(local_430);
          if (local_4c8 != &local_4b8) {
            operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(local_328);
          std::ios_base::~ios_base(local_2b8);
          std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
          std::ios_base::~ios_base(local_138);
          _Unwind_Resume(uVar7);
        }
        if (local_4c8[uVar10] != '#') goto LAB_00a5e463;
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_328,local_4c8,local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream(local_4a0);
  std::ios_base::~ios_base(local_430);
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_328);
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string injectExtensionRequirements (const std::string& baseCode, const std::vector<RequiredExtension>& extensions, glu::ShaderType shaderType)
{
	std::istringstream	baseCodeBuf					(baseCode);
	std::ostringstream	resultBuf;
	std::string			line;
	bool				firstNonPreprocessorLine	= true;
	std::ostringstream	extStr;

	generateExtensionStatements(extStr, extensions, shaderType);

	// skip if no requirements
	if (extStr.str().empty())
		return baseCode;

	while (std::getline(baseCodeBuf, line))
	{
		// begins with '#'?
		const std::string::size_type	firstNonWhitespace		= line.find_first_not_of("\t ");
		const bool						isPreprocessorDirective	= (firstNonWhitespace != std::string::npos && line.at(firstNonWhitespace) == '#');

		// Inject #extensions
		if (!isPreprocessorDirective && firstNonPreprocessorLine)
		{
			firstNonPreprocessorLine = false;
			resultBuf << extStr.str();
		}

		resultBuf << line << "\n";
	}

	return resultBuf.str();
}